

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O3

Abc_ManRef_t * Abc_NtkManRefStart(int nNodeSizeMax,int nConeSizeMax,int fUseDcs,int fVerbose)

{
  undefined4 uVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Abc_ManRef_t *pAVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  long lVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  
  pAVar7 = (Abc_ManRef_t *)calloc(1,0xa8);
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  pcVar9 = (char *)malloc(100);
  pVVar8->pArray = pcVar9;
  pAVar7->vCube = pVVar8;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(800);
  pVVar10->pArray = ppvVar11;
  pAVar7->vVisited = pVVar10;
  pAVar7->nNodeSizeMax = nNodeSizeMax;
  pAVar7->nConeSizeMax = nConeSizeMax;
  pAVar7->fVerbose = fVerbose;
  uVar20 = 6;
  if (6 < nNodeSizeMax) {
    uVar20 = (ulong)(uint)nNodeSizeMax;
  }
  iVar21 = (int)uVar20;
  iVar16 = iVar21 + -5;
  uVar19 = 1 << ((byte)iVar16 & 0x1f);
  ppvVar11 = (void **)malloc(((long)(int)uVar19 * 4 + 8) * uVar20);
  lVar12 = uVar20 * 8;
  uVar15 = 0;
  do {
    ppvVar11[uVar15] = (void *)((long)ppvVar11 + lVar12);
    uVar15 = uVar15 + 1;
    lVar12 = lVar12 + (long)(int)uVar19 * 4;
  } while (uVar20 != uVar15);
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nSize = iVar21;
  pVVar10->nCap = iVar21;
  pVVar10->pArray = ppvVar11;
  auVar6 = _DAT_0093e4e0;
  auVar5 = _DAT_0093d220;
  auVar4 = _DAT_0093d210;
  uVar15 = (ulong)uVar19;
  lVar12 = uVar15 - 1;
  auVar22._8_4_ = (int)lVar12;
  auVar22._0_8_ = lVar12;
  auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
  uVar17 = 0;
  auVar22 = auVar22 ^ _DAT_0093d220;
  do {
    pvVar2 = ppvVar11[uVar17];
    iVar21 = auVar22._0_4_;
    iVar23 = auVar22._4_4_;
    if (uVar17 < 5) {
      if (iVar16 != 0x1f) {
        uVar1 = (&DAT_0098eec0)[uVar17];
        uVar18 = 0;
        auVar24 = auVar4;
        auVar25 = auVar6;
        do {
          auVar26 = auVar24 ^ auVar5;
          if ((bool)(~(auVar26._4_4_ == iVar23 && iVar21 < auVar26._0_4_ || iVar23 < auVar26._4_4_)
                    & 1)) {
            *(undefined4 *)((long)pvVar2 + uVar18 * 4) = uVar1;
          }
          if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
              auVar26._12_4_ <= auVar22._12_4_) {
            *(undefined4 *)((long)pvVar2 + uVar18 * 4 + 4) = uVar1;
          }
          iVar27 = SUB164(auVar25 ^ auVar5,4);
          if (iVar27 <= iVar23 && (iVar27 != iVar23 || SUB164(auVar25 ^ auVar5,0) <= iVar21)) {
            *(undefined4 *)((long)pvVar2 + uVar18 * 4 + 8) = uVar1;
            *(undefined4 *)((long)pvVar2 + uVar18 * 4 + 0xc) = uVar1;
          }
          uVar18 = uVar18 + 4;
          lVar12 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 4;
          auVar24._8_8_ = lVar12 + 4;
          lVar12 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 4;
          auVar25._8_8_ = lVar12 + 4;
        } while ((uVar15 + 3 & 0xfffffffffffffffc) != uVar18);
      }
    }
    else if (iVar16 != 0x1f) {
      uVar19 = 1 << ((char)uVar17 - 5U & 0x1f);
      uVar18 = 0;
      auVar26 = auVar4;
      do {
        bVar3 = iVar21 < SUB164(auVar26 ^ auVar5,0);
        iVar27 = SUB164(auVar26 ^ auVar5,4);
        if ((bool)(~(iVar23 < iVar27 || iVar27 == iVar23 && bVar3) & 1)) {
          *(uint *)((long)pvVar2 + uVar18 * 4) = -(uint)((uVar19 & (uint)uVar18) != 0);
        }
        if (iVar23 >= iVar27 && (iVar27 != iVar23 || !bVar3)) {
          *(uint *)((long)pvVar2 + uVar18 * 4 + 4) = -(uint)(((uint)uVar18 + 1 & uVar19) != 0);
        }
        uVar18 = uVar18 + 2;
        lVar12 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar12 + 2;
      } while ((uVar15 + 1 & 0x1fffffffe) != uVar18);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != uVar20);
  pAVar7->vVars = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(800);
  pVVar10->pArray = ppvVar11;
  pAVar7->vFuncs = pVVar10;
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  pVVar13->nCap = 0x10000;
  pVVar13->nSize = 0;
  piVar14 = (int *)malloc(0x40000);
  pVVar13->pArray = piVar14;
  pAVar7->vMemory = pVVar13;
  return pAVar7;
}

Assistant:

Abc_ManRef_t * Abc_NtkManRefStart( int nNodeSizeMax, int nConeSizeMax, int fUseDcs, int fVerbose )
{
    Abc_ManRef_t * p;
    p = ABC_ALLOC( Abc_ManRef_t, 1 );
    memset( p, 0, sizeof(Abc_ManRef_t) );
    p->vCube        = Vec_StrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->fVerbose     = fVerbose;
    p->vVars        = Vec_PtrAllocTruthTables( Abc_MaxInt(nNodeSizeMax, 6) );
    p->vFuncs       = Vec_PtrAlloc( 100 );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    return p;
}